

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# prod_tests1.cpp
# Opt level: O0

void __thiscall
test::prod_test::iu_PeepTest_x_iutest_x_Function_Test::Body
          (iu_PeepTest_x_iutest_x_Function_Test *this)

{
  bool bVar1;
  char *pcVar2;
  code *local_440;
  code *local_408;
  AssertionHelper local_3f0;
  Fixed local_3c0;
  int local_238 [2];
  undefined1 local_230 [8];
  AssertionResult iutest_ar_1;
  Fixed local_1d8;
  int local_40 [2];
  undefined1 local_38 [8];
  AssertionResult iutest_ar;
  iu_PeepTest_x_iutest_x_Function_Test *this_local;
  
  if (((ulong)iutest::detail::
              peep_tag<test::prod_test::iu_peep_tag_SetX<test::prod_test::ProdClass>>::value & 1) ==
      0) {
    local_408 = iutest::detail::
                peep_tag<test::prod_test::iu_peep_tag_SetX<test::prod_test::ProdClass>>::value;
  }
  else {
    local_408 = *(code **)(iutest::detail::
                           peep_tag<test::prod_test::iu_peep_tag_SetX<test::prod_test::ProdClass>>::
                           value + *(long *)(s_prod + DAT_00634548) + -1);
  }
  iutest_ar._32_8_ = this;
  (*local_408)(s_prod + DAT_00634548,100);
  iutest::detail::AlwaysZero();
  local_40[1] = 100;
  local_40[0] = ProdClass::GetX((ProdClass *)s_prod);
  iutest::internal::backward::EqHelper<false>::Compare<int>
            ((AssertionResult *)local_38,"100","s_prod.GetX()",local_40 + 1,local_40);
  bVar1 = iutest::AssertionResult::operator_cast_to_bool((AssertionResult *)local_38);
  if (!bVar1) {
    memset(&local_1d8,0,0x188);
    iutest::AssertionHelper::Fixed::Fixed(&local_1d8);
    pcVar2 = iutest::AssertionResult::message((AssertionResult *)local_38);
    iutest::AssertionHelper::AssertionHelper
              ((AssertionHelper *)&iutest_ar_1.m_result,
               "/workspace/llm4binary/github/license_c_cmakelists/srz-zumix[P]iutest/test/prod_tests1.cpp"
               ,0xfd,pcVar2,kNonFatalFailure);
    iutest::AssertionHelper::operator=((AssertionHelper *)&iutest_ar_1.m_result,&local_1d8);
    iutest::AssertionHelper::~AssertionHelper((AssertionHelper *)&iutest_ar_1.m_result);
    iutest::AssertionHelper::Fixed::~Fixed(&local_1d8);
  }
  iutest::AssertionResult::~AssertionResult((AssertionResult *)local_38);
  iutest::detail::AlwaysZero();
  local_238[1] = 100;
  if (((ulong)iutest::detail::
              peep_tag<test::prod_test::iu_peep_tag_ConstGetX<test::prod_test::ProdClass>>::value &
      1) == 0) {
    local_440 = iutest::detail::
                peep_tag<test::prod_test::iu_peep_tag_ConstGetX<test::prod_test::ProdClass>>::value;
  }
  else {
    local_440 = *(code **)(iutest::detail::
                           peep_tag<test::prod_test::iu_peep_tag_ConstGetX<test::prod_test::ProdClass>>
                           ::value + *(long *)(s_prod + DAT_00634568) + -1);
  }
  local_238[0] = (*local_440)(s_prod + DAT_00634568);
  iutest::internal::backward::EqHelper<false>::Compare<int>
            ((AssertionResult *)local_230,"100",
             "(s_prod.*::iutest::detail::peep_tag< iu_peep_tag_ConstGetX<ProdClass> >::value)()",
             local_238 + 1,local_238);
  bVar1 = iutest::AssertionResult::operator_cast_to_bool((AssertionResult *)local_230);
  if (!bVar1) {
    memset(&local_3c0,0,0x188);
    iutest::AssertionHelper::Fixed::Fixed(&local_3c0);
    pcVar2 = iutest::AssertionResult::message((AssertionResult *)local_230);
    iutest::AssertionHelper::AssertionHelper
              (&local_3f0,
               "/workspace/llm4binary/github/license_c_cmakelists/srz-zumix[P]iutest/test/prod_tests1.cpp"
               ,0xfe,pcVar2,kNonFatalFailure);
    iutest::AssertionHelper::operator=(&local_3f0,&local_3c0);
    iutest::AssertionHelper::~AssertionHelper(&local_3f0);
    iutest::AssertionHelper::Fixed::~Fixed(&local_3c0);
  }
  iutest::AssertionResult::~AssertionResult((AssertionResult *)local_230);
  return;
}

Assistant:

IUTEST(PeepTest, Function)
{
    IUTEST_PEEP_GET(s_prod, ProdClass, SetX)(100);
    IUTEST_EXPECT_EQ(100, s_prod.GetX());
    IUTEST_EXPECT_EQ(100, IUTEST_PEEP_GET(s_prod, ProdClass, ConstGetX)());
}